

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envydis.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  undefined8 *puVar8;
  char **in_RSI;
  int in_EDI;
  bool bVar9;
  int cnt;
  int c_1;
  ull t;
  uint8_t *code;
  int maxnum;
  int num;
  label nl_1;
  int comps;
  char name [200];
  char *tmp;
  char buf [1000];
  char type;
  label nl;
  FILE *mapfile;
  uint limit;
  uint skip;
  uint base;
  int c;
  int vartype;
  int ptype;
  int len;
  char *varname;
  int quiet;
  int bin;
  int w;
  int labelsmax;
  int labelsnum;
  label *labels;
  disisa *isa;
  FILE *infile;
  undefined4 in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  disisa *in_stack_fffffffffffffa38;
  ulong local_590;
  void *local_588;
  int local_580;
  uint local_57c;
  undefined8 local_578;
  undefined8 local_570;
  undefined4 local_568;
  undefined4 uStack_564;
  int local_55c;
  char local_558 [200];
  char *local_490;
  char local_488 [188];
  int in_stack_fffffffffffffc34;
  int in_stack_fffffffffffffc38;
  uint32_t in_stack_fffffffffffffc3c;
  uint8_t *in_stack_fffffffffffffc40;
  FILE *in_stack_fffffffffffffc48;
  disisa *in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc68;
  label *in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffc78;
  char local_91;
  char *local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined4 uStack_7c;
  FILE *local_78;
  uint local_6c;
  uint local_68 [3];
  int local_5c;
  undefined4 local_58;
  int local_54;
  char *local_50;
  undefined4 local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  void *local_30;
  disisa *local_28;
  FILE *local_20;
  char **local_18;
  int local_10;
  int local_c;
  
  local_c = 0;
  local_20 = _stdin;
  local_28 = (disisa *)0x0;
  local_30 = (void *)0x0;
  local_34 = 0;
  local_38 = 0;
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_50 = (char *)0x0;
  local_18 = in_RSI;
  local_10 = in_EDI;
  pcVar6 = __xpg_basename(*in_RSI);
  *local_18 = pcVar6;
  sVar7 = strlen(*local_18);
  local_54 = (int)sVar7;
  if ((3 < local_54) && (iVar5 = strcmp(*local_18 + (long)local_54 + -3,"dis"), iVar5 == 0)) {
    (*local_18)[local_54 + -3] = '\0';
    local_28 = ed_getisa((char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    if ((local_28 != (disisa *)0x0) && (local_28->opunit == 4)) {
      local_3c = 1;
    }
  }
  local_58 = 0xffffffff;
  local_5c = -1;
  local_68[1] = 0;
  local_68[0] = 0;
  local_6c = 0;
  while (local_68[2] = getopt(local_10,local_18,"vgfpcsb:d:l:m:V:wWinqu:M:"), local_68[2] != -1) {
    switch(local_68[2]) {
    case 0x4d:
      local_78 = fopen(_optarg,"r");
      if (local_78 == (FILE *)0x0) {
        perror(_optarg);
        return 1;
      }
      memset(local_488,0,1000);
      while (pcVar6 = fgets(local_488,1000,local_78), pcVar6 != (char *)0x0) {
        if ((local_488[0] != '#') && (local_488[0] != '\n')) {
          local_490 = strchr(local_488,0x23);
          if (local_490 != (char *)0x0) {
            local_490 = (char *)0x0;
          }
          local_55c = __isoc99_sscanf(local_488,"%c%llx%s%x",&local_91,&local_88,local_558,
                                      &uStack_7c);
          if (local_55c < 2) {
            fprintf(_stderr,"Malformated input: %s\n",local_488);
          }
          else {
            switch(local_91) {
            case 'B':
              local_80 = 1;
              break;
            case 'C':
              local_80 = 2;
              break;
            case 'D':
              local_80 = 0x10;
              break;
            case 'E':
              local_80 = 4;
              break;
            default:
              fprintf(_stderr,"Unknown label type %c\n",(ulong)(uint)(int)local_91);
              return 1;
            case 'N':
              local_80 = 0x42;
              break;
            case 'S':
              local_80 = 0x20;
            }
            if (local_55c < 4) {
              uStack_7c = 0;
            }
            if (local_55c < 3) {
              local_90 = (char *)0x0;
            }
            else {
              local_90 = strdup(local_558);
            }
            if (local_38 <= local_34) {
              if (local_38 == 0) {
                local_38 = 0x10;
              }
              else {
                local_38 = local_38 << 1;
              }
              local_30 = realloc(local_30,(long)local_38 * 0x18);
            }
            puVar8 = (undefined8 *)((long)local_30 + (long)local_34 * 0x18);
            *puVar8 = local_90;
            puVar8[1] = local_88;
            puVar8[2] = CONCAT44(uStack_7c,local_80);
            local_34 = local_34 + 1;
          }
        }
      }
      break;
    case 0x56:
      local_50 = _optarg;
      break;
    case 0x57:
      local_3c = 2;
      break;
    case 0x62:
      __isoc99_sscanf(_optarg,"%x",local_68 + 1);
      break;
    case 99:
      local_58 = 8;
      break;
    case 100:
      __isoc99_sscanf(_optarg,"%x",local_68);
      break;
    case 0x66:
    case 0x70:
      local_58 = 4;
      break;
    case 0x67:
      local_58 = 2;
      break;
    case 0x69:
      local_40 = 1;
      break;
    case 0x6c:
      __isoc99_sscanf(_optarg,"%x",&local_6c);
      break;
    case 0x6d:
      local_28 = ed_getisa((char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
      if (local_28 == (disisa *)0x0) {
        fprintf(_stderr,"Unknown architecure \"%s\"!\n",_optarg);
        return 1;
      }
      break;
    case 0x6e:
      cnorm = "";
      cname = "";
      creg0 = "";
      creg1 = "";
      cmem = "";
      cnum = "";
      cunk = "";
      cbtarg = "";
      cctarg = "";
      cbctarg = "";
      break;
    case 0x71:
      local_44 = 1;
      break;
    case 0x73:
      local_58 = 7;
      break;
    case 0x75:
      __isoc99_sscanf(_optarg,"%llx",&local_570);
      local_568 = 1;
      local_578 = 0;
      if (local_38 <= local_34) {
        if (local_38 == 0) {
          local_38 = 0x10;
        }
        else {
          local_38 = local_38 << 1;
        }
        local_30 = realloc(local_30,(long)local_38 * 0x18);
      }
      puVar8 = (undefined8 *)((long)local_30 + (long)local_34 * 0x18);
      *puVar8 = local_578;
      puVar8[1] = local_570;
      puVar8[2] = CONCAT44(uStack_564,local_568);
      local_34 = local_34 + 1;
      break;
    case 0x76:
      local_58 = 1;
      break;
    case 0x77:
      local_3c = 1;
    }
  }
  if (_optind < local_10) {
    local_20 = fopen(local_18[_optind],"r");
    if (local_20 == (FILE *)0x0) {
      perror(local_18[_optind]);
      return 1;
    }
    _optind = _optind + 1;
    if (_optind < local_10) {
      fprintf(_stderr,"Too many parameters!\n");
      return 1;
    }
  }
  if (local_28 == (disisa *)0x0) {
    fprintf(_stderr,"No architecture specified!\n");
    local_c = 1;
  }
  else if ((local_50 == (char *)0x0) ||
          (local_5c = ed_getvariant(in_stack_fffffffffffffa38,
                                    (char *)CONCAT44(in_stack_fffffffffffffa34,
                                                     in_stack_fffffffffffffa30)), local_5c != 0)) {
    local_57c = 0;
    local_580 = 0x10;
    local_588 = malloc(0x10);
    if (local_40 == 0) {
      while( true ) {
        iVar5 = feof(local_20);
        bVar9 = false;
        if (iVar5 == 0) {
          iVar5 = __isoc99_fscanf(local_20,"%llx",&local_590);
          bVar9 = iVar5 == 1;
        }
        if (!bVar9) break;
        if (local_580 <= (int)(local_57c + 3)) {
          local_580 = local_580 << 1;
          local_588 = realloc(local_588,(long)local_580);
        }
        uVar1 = (undefined1)local_590;
        uVar2 = (undefined1)(local_590 >> 8);
        uVar3 = (undefined1)(local_590 >> 0x10);
        uVar4 = (undefined1)(local_590 >> 0x18);
        if (local_3c == 2) {
          *(undefined1 *)((long)local_588 + (long)(int)local_57c) = uVar1;
          *(undefined1 *)((long)local_588 + (long)(int)(local_57c + 1)) = uVar2;
          *(undefined1 *)((long)local_588 + (long)(int)(local_57c + 2)) = uVar3;
          *(undefined1 *)((long)local_588 + (long)(int)(local_57c + 3)) = uVar4;
          *(char *)((long)local_588 + (long)(int)(local_57c + 4)) = (char)(local_590 >> 0x20);
          *(char *)((long)local_588 + (long)(int)(local_57c + 5)) = (char)(local_590 >> 0x28);
          *(char *)((long)local_588 + (long)(int)(local_57c + 6)) = (char)(local_590 >> 0x30);
          *(char *)((long)local_588 + (long)(int)(local_57c + 7)) = (char)(local_590 >> 0x38);
          local_590 = local_590 >> 0x38;
          local_57c = local_57c + 8;
        }
        else if (local_3c == 0) {
          *(undefined1 *)((long)local_588 + (long)(int)local_57c) = uVar1;
          local_57c = local_57c + 1;
        }
        else {
          *(undefined1 *)((long)local_588 + (long)(int)local_57c) = uVar1;
          *(undefined1 *)((long)local_588 + (long)(int)(local_57c + 1)) = uVar2;
          *(undefined1 *)((long)local_588 + (long)(int)(local_57c + 2)) = uVar3;
          local_590 = local_590 >> 0x18;
          *(undefined1 *)((long)local_588 + (long)(int)(local_57c + 3)) = uVar4;
          local_57c = local_57c + 4;
        }
        __isoc99_fscanf(local_20," ,");
      }
    }
    else {
      while (iVar5 = getc(local_20), iVar5 != -1) {
        if (local_580 <= (int)(local_57c + 3)) {
          local_580 = local_580 << 1;
          local_588 = realloc(local_588,(long)local_580);
        }
        *(char *)((long)local_588 + (long)(int)local_57c) = (char)iVar5;
        local_57c = local_57c + 1;
      }
    }
    if (local_68[0] < local_57c) {
      envydis(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
              in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,in_stack_fffffffffffffc34,
              in_stack_fffffffffffffc60,in_stack_fffffffffffffc68,in_stack_fffffffffffffc70,
              in_stack_fffffffffffffc78);
      local_c = 0;
    }
    else {
      local_c = 0;
    }
  }
  else {
    fprintf(_stderr,"Unknown variant \"%s\"!\n",local_50);
    local_c = 1;
  }
  return local_c;
}

Assistant:

int main(int argc, char **argv) {
	FILE *infile = stdin;
	const struct disisa *isa = 0;
	struct label *labels = 0;
	int labelsnum = 0;
	int labelsmax = 0;
	int w = 0, bin = 0, quiet = 0;
	const char *varname = 0;
	argv[0] = basename(argv[0]);
	int len = strlen(argv[0]);
	if (len > 3 && !strcmp(argv[0] + len - 3, "dis")) {
		argv[0][len-3] = 0;
		isa = ed_getisa(argv[0]);
		if (isa && isa->opunit == 4)
			w = 1;
	}
	int ptype = -1;
	int vartype = -1;
	int c;
	unsigned base = 0, skip = 0, limit = 0;
	while ((c = getopt (argc, argv, "vgfpcsb:d:l:m:V:wWinqu:M:")) != -1)
		switch (c) {
			case 'v':
				ptype = VP;
				break;
			case 'g':
				ptype = GP;
				break;
			case 'f':
			case 'p':
				ptype = FP;
				break;
			case 'c':
				ptype = CP;
				break;
			case 's':
				ptype = VP|GP|FP;
				break;
			case 'b':
				sscanf(optarg, "%x", &base);
				break;
			case 'd':
				sscanf(optarg, "%x", &skip);
				break;
			case 'l':
				sscanf(optarg, "%x", &limit);
				break;
			case 'w':
				w = 1;
				break;
			case 'W':
				w = 2;
				break;
			case 'i':
				bin = 1;
				break;
			case 'q':
				quiet = 1;
				break;
			case 'n':
				cnorm = "";
				cname = "";
				creg0 = "";
				creg1 = "";
				cmem = "";
				cnum = "";
				cunk = "";
				cbtarg = "";
				cctarg = "";
				cbctarg = "";
				break;
			case 'm':
				isa = ed_getisa(optarg);
				if (!isa) {
					fprintf (stderr, "Unknown architecure \"%s\"!\n", optarg);
					return 1;
				}
				break;
			case 'V':
				varname = optarg;
				break;
			case 'M':
				{
					FILE *mapfile = fopen(optarg, "r");
					if (!mapfile) {
						perror(optarg);
						return 1;
					}
					struct label nl;
					char type;
					char buf[1000] = "";

					while(fgets(buf, sizeof(buf), mapfile)) {

						if (buf[0] == '#' || buf[0] == '\n')
							continue;

						char* tmp = strchr(buf, '#');
						if (tmp)
							tmp = '\0';

						char name[200];
						int comps = sscanf(buf, "%c%llx%s%x", &type, &nl.val, name, &nl.size);;
						if (comps < 2) {
							fprintf(stderr, "Malformated input: %s\n", buf);
							continue;
						}

						switch (type) {
							case 'B':
								nl.type = 1;
								break;
							case 'C':
								nl.type = 2;
								break;
							case 'E':
								nl.type = 4;
								break;
							case 'S':
								nl.type = 0x20;
								break;
							case 'N':
								nl.type = 0x42;
								break;
							case 'D':
								nl.type = 0x10;
								break;
							default:
								fprintf (stderr, "Unknown label type %c\n", type);
								return 1;
						}
						if (comps < 4)
							nl.size = 0;
						if (comps >= 3)
							nl.name = strdup(name);
						else
							nl.name = 0;
						ADDARRAY(labels, nl);
					}
					break;
				}
			case 'u':
				{
					struct label nl;
					sscanf(optarg, "%llx", &nl.val);
					nl.type = 1;
					nl.name = 0;
					ADDARRAY(labels, nl);
					break;
				}
		}
	if (optind < argc) {
		if (!(infile = fopen(argv[optind], "r"))) {
			perror(argv[optind]);
			return 1;
		}
		optind++;
		if (optind < argc) {
			fprintf (stderr, "Too many parameters!\n");
			return 1;
		}
	}
	if (!isa) {
		fprintf (stderr, "No architecture specified!\n");
		return 1;
	}
	if (varname) {
		vartype = ed_getvariant(isa, varname);
		if (!vartype) {
			fprintf (stderr, "Unknown variant \"%s\"!\n", varname);
			return 1;
		}
	}
	int num = 0;
	int maxnum = 16;
	uint8_t *code = malloc (maxnum);
	ull t;
	if (bin) {
		int c;
		while ((c = getc(infile)) != EOF) {
			if (num + 3 >= maxnum) maxnum *= 2, code = realloc (code, maxnum);
			code[num++] = c;
		}
	} else {
		while (!feof(infile) && fscanf (infile, "%llx", &t) == 1) {
			if (num + 3 >= maxnum) maxnum *= 2, code = realloc (code, maxnum);
			if (w == 2) {
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
			} else if (w) {
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
			} else
				code[num++] = t;
			fscanf (infile, " ,");
		}
	}
	if (num <= skip)
		return 0;
	int cnt = num - skip;
	if (limit && limit < cnt)
		cnt = limit;
	envydis (isa, stdout, code+skip, base, cnt, vartype, ptype, quiet, labels, labelsnum);
	return 0;
}